

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtl.cpp
# Opt level: O3

void __thiscall pg::RTLSolver::RTLSolver(RTLSolver *this,Oink *oink,Game *game)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  undefined1 auVar3 [64];
  undefined1 auVar4 [32];
  
  Solver::Solver(&this->super_Solver,oink,game);
  auVar1 = ZEXT816(0) << 0x40;
  (this->super_Solver)._vptr_Solver = (_func_int **)&PTR__RTLSolver_001b1af8;
  (this->pea_S).pointer = 0;
  (this->pea_S).queue = (uint *)0x0;
  this->pea_root = (bitset)ZEXT1632(auVar1);
  this->onesided = false;
  *(undefined1 (*) [32])&this->iterations = ZEXT1632(auVar1);
  *(undefined4 *)
   ((long)&(this->tout).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  auVar2 = ZEXT1632(auVar1);
  this->tv = (vector<int_*,_std::allocator<int_*>_>)auVar2._0_24_;
  (this->tpr).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)auVar2._24_8_;
  *(undefined1 (*) [32])
   ((long)&(this->tpr).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
           ._M_start + 4) = auVar2;
  this->tangle = (vector<int,_std::allocator<int>_>)auVar2._0_24_;
  (this->tangleto).queue = (uint *)auVar2._24_8_;
  auVar3 = ZEXT464(0) << 0x40;
  (this->tangleto).pointer = 0;
  auVar2 = auVar3._0_32_;
  auVar4 = auVar3._32_32_;
  (this->S)._bits = (uint64_t *)auVar2._0_8_;
  (this->S)._size = auVar2._8_8_;
  (this->S)._bitssize = auVar2._16_8_;
  (this->S)._allocsize = auVar2._24_8_;
  (this->V)._bits = (uint64_t *)auVar4._0_8_;
  (this->V)._size = auVar4._8_8_;
  (this->V)._bitssize = auVar4._16_8_;
  (this->V)._allocsize = auVar4._24_8_;
  auVar2 = auVar3._0_32_;
  auVar4 = auVar3._32_32_;
  (this->escapes)._bits = (uint64_t *)auVar2._0_8_;
  (this->escapes)._size = auVar2._8_8_;
  (this->escapes)._bitssize = auVar2._16_8_;
  (this->escapes)._allocsize = auVar2._24_8_;
  (this->R)._bits = (uint64_t *)auVar4._0_8_;
  (this->R)._size = auVar4._8_8_;
  (this->R)._bitssize = auVar4._16_8_;
  (this->R)._allocsize = auVar4._24_8_;
  auVar2 = auVar3._0_32_;
  auVar4 = auVar3._32_32_;
  (this->Z)._bits = (uint64_t *)auVar2._0_8_;
  (this->Z)._size = auVar2._8_8_;
  (this->Z)._bitssize = auVar2._16_8_;
  (this->Z)._allocsize = auVar2._24_8_;
  (this->G)._bits = (uint64_t *)auVar4._0_8_;
  (this->G)._size = auVar4._8_8_;
  (this->G)._bitssize = auVar4._16_8_;
  (this->G)._allocsize = auVar4._24_8_;
  *(undefined1 (*) [64])((long)&(this->V)._size + 4) = auVar3;
  return;
}

Assistant:

RTLSolver::RTLSolver(Oink& oink, Game& game) : Solver(oink, game)
{
}